

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O1

int Ndr_ObjReadRange(Ndr_Data_t *p,int Obj,int *End,int *Beg)

{
  byte bVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  int iVar7;
  
  iVar5 = Obj + 1;
  puVar3 = p->pBody;
  if (iVar5 < (int)(puVar3[Obj] + Obj)) {
    puVar6 = (uint *)0x0;
    iVar7 = 0;
    do {
      bVar1 = p->pHead[iVar5];
      if (bVar1 == 8) {
        iVar7 = iVar7 + 1;
        if (puVar6 == (uint *)0x0) {
          puVar6 = puVar3 + iVar5;
        }
      }
      else {
        if (bVar1 == 0) {
          __assert_fail("p->pHead[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/ndr.h"
                        ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
        }
        if (puVar6 != (uint *)0x0) break;
      }
      uVar4 = 1;
      if (bVar1 < 4) {
        uVar4 = puVar3[iVar5];
      }
      iVar5 = iVar5 + uVar4;
    } while (iVar5 < (int)(puVar3[Obj] + Obj));
  }
  else {
    puVar6 = (uint *)0x0;
    iVar7 = 0;
  }
  *Beg = 0;
  *End = 0;
  if (iVar7 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = (uint)(iVar7 == 3);
    uVar2 = *puVar6;
    if (iVar7 == 1) {
      *Beg = uVar2;
      *End = uVar2;
    }
    else {
      *End = uVar2;
      *Beg = puVar6[1];
    }
  }
  return uVar4;
}

Assistant:

int Ndr_ObjReadRange( Ndr_Data_t * p, int Obj, int * End, int * Beg )
{
    int * pArray, nArray = Ndr_ObjReadArray( p, Obj, NDR_RANGE, &pArray );
    int Signed = 0; *End = *Beg = 0;
    if ( nArray == 0 )
        return 0;
    if ( nArray == 3 )
        Signed = 1;
    if ( nArray == 1 )
        *End = *Beg = pArray[0];
    else
        *End = pArray[0], *Beg = pArray[1];
    return Signed;
}